

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool adios2sys::SystemTools::GetFileId(string *file,FileId *id)

{
  int iVar1;
  char *__file;
  dev_t *in_RSI;
  stat fileStat;
  UnixFileId local_c0;
  stat local_a8;
  dev_t *local_18;
  
  local_18 = in_RSI;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,&local_a8);
  if (iVar1 == 0) {
    UnixFileId::UnixFileId(&local_c0,local_a8.st_dev,local_a8.st_ino,local_a8.st_size);
    *local_18 = local_c0.m_volumeSerialNumber;
    local_18[1] = local_c0.m_fileSerialNumber;
    local_18[2] = local_c0.m_fileSize;
  }
  return iVar1 == 0;
}

Assistant:

bool SystemTools::GetFileId(const std::string& file, FileId& id)
{
#ifdef _WIN32
  HANDLE hFile =
    CreateFileW(Encoding::ToWide(file).c_str(), GENERIC_READ, FILE_SHARE_READ,
                nullptr, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
  if (hFile != INVALID_HANDLE_VALUE) {
    BY_HANDLE_FILE_INFORMATION fiBuf;
    GetFileInformationByHandle(hFile, &fiBuf);
    CloseHandle(hFile);
    id = FileId(fiBuf.dwVolumeSerialNumber, fiBuf.nFileIndexHigh,
                fiBuf.nFileIndexLow);
    return true;
  } else {
    return false;
  }
#else
  struct stat fileStat;
  if (stat(file.c_str(), &fileStat) == 0) {
    id = FileId(fileStat.st_dev, fileStat.st_ino, fileStat.st_size);
    return true;
  }
  return false;
#endif
}